

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O3

xmlChar * xmlTextReaderConstBaseUri(xmlTextReaderPtr reader)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlChar *tmp;
  xmlChar *local_10;
  
  if ((reader != (xmlTextReaderPtr)0x0) && (reader->node != (xmlNode *)0x0)) {
    iVar1 = xmlNodeGetBaseSafe((xmlDoc *)0x0,reader->node,&local_10);
    if (iVar1 < 0) {
      xmlTextReaderErrMemory(reader);
    }
    if (local_10 != (xmlChar *)0x0) {
      pxVar2 = constString(reader,local_10);
      (*xmlFree)(local_10);
      return pxVar2;
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlTextReaderConstBaseUri(xmlTextReaderPtr reader) {
    xmlChar *tmp;
    const xmlChar *ret;
    int result;

    if ((reader == NULL) || (reader->node == NULL))
	return(NULL);
    result = xmlNodeGetBaseSafe(NULL, reader->node, &tmp);
    if (result < 0)
        xmlTextReaderErrMemory(reader);
    if (tmp == NULL)
        return(NULL);
    ret = constString(reader, tmp);
    xmlFree(tmp);
    return(ret);
}